

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_data.hpp
# Opt level: O2

void __thiscall
duckdb::MultiFileColumnDefinition::~MultiFileColumnDefinition(MultiFileColumnDefinition *this)

{
  Value::~Value(&this->identifier);
  ::std::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>::
  ~unique_ptr(&(this->default_expression).
               super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             );
  ::std::
  vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>::
  ~vector(&(this->children).
           super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
         );
  LogicalType::~LogicalType(&this->type);
  ::std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

MultiFileColumnDefinition(const string &name, const LogicalType &type) : name(name), type(type) {
	}